

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::jacobiEigenSolver<float>
               (Matrix33<float> *A,Vec3<float> *S,Matrix33<float> *V,float tol)

{
  undefined8 uVar1;
  int i;
  long lVar2;
  float *pfVar3;
  uint uVar4;
  bool bVar5;
  BaseType BVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_48 [4];
  float local_38;
  float local_34;
  
  local_38 = tol;
  Matrix33<float>::makeIdentity(V);
  pfVar3 = (float *)A;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    (&S->x)[lVar2] = *pfVar3;
    pfVar3 = pfVar3 + 4;
  }
  BVar6 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix33<float>>(A);
  local_34 = BVar6 * local_38;
  if ((local_34 != 0.0) || (NAN(local_34))) {
    uVar4 = 0;
    while( true ) {
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      fVar12 = A->x[0][0];
      fVar11 = A->x[0][1];
      fVar10 = A->x[1][1];
      fVar9 = fVar10 - fVar12;
      fVar7 = ABS(fVar11 + fVar11);
      fVar8 = ABS(fVar9) * local_38;
      if (fVar7 <= fVar8) {
        A->x[0][1] = 0.0;
      }
      else {
        fVar9 = fVar9 / (fVar11 + fVar11);
        fVar9 = *(float *)(&DAT_0014a120 + (ulong)(fVar9 < 0.0) * 4) /
                (SQRT(fVar9 * fVar9 + 1.0) + ABS(fVar9));
        fVar14 = 1.0 / SQRT(fVar9 * fVar9 + 1.0);
        fVar11 = fVar11 * fVar9;
        fVar9 = fVar9 * fVar14;
        local_48[0] = 0.0 - fVar11;
        local_48[1] = fVar11 + 0.0;
        A->x[0][0] = fVar12 - fVar11;
        A->x[1][1] = fVar10 + fVar11;
        A->x[0][1] = 0.0;
        fVar12 = fVar9 / (fVar14 + 1.0);
        fVar11 = A->x[0][2];
        fVar10 = A->x[1][2];
        A->x[0][2] = fVar11 - (fVar12 * fVar11 + fVar10) * fVar9;
        A->x[1][2] = (fVar11 - fVar12 * fVar10) * fVar9 + fVar10;
        for (lVar2 = 0; lVar2 != 0x24; lVar2 = lVar2 + 0xc) {
          uVar1 = *(undefined8 *)((long)V->x[0] + lVar2);
          fVar11 = (float)uVar1;
          fVar10 = (float)((ulong)uVar1 >> 0x20);
          *(ulong *)((long)V->x[0] + lVar2) =
               CONCAT44((-fVar12 * fVar10 + fVar11) * fVar9 + fVar10,
                        (fVar12 * fVar11 + fVar10) * -fVar9 + fVar11);
        }
        fVar12 = A->x[0][0];
      }
      fVar9 = local_48[1];
      fVar11 = A->x[0][2];
      fVar10 = A->x[2][2];
      fVar14 = ABS(fVar11 + fVar11);
      fVar13 = ABS(fVar10 - fVar12) * local_38;
      if (fVar14 <= fVar13) {
        A->x[0][2] = 0.0;
      }
      else {
        fVar15 = (fVar10 - fVar12) / (fVar11 + fVar11);
        fVar15 = *(float *)(&DAT_0014a120 + (ulong)(fVar15 < 0.0) * 4) /
                 (SQRT(fVar15 * fVar15 + 1.0) + ABS(fVar15));
        fVar16 = 1.0 / SQRT(fVar15 * fVar15 + 1.0);
        fVar11 = fVar11 * fVar15;
        fVar15 = fVar15 * fVar16;
        fVar16 = fVar15 / (fVar16 + 1.0);
        local_48[0] = local_48[0] - fVar11;
        local_48[2] = fVar11 + 0.0;
        A->x[0][0] = fVar12 - fVar11;
        A->x[2][2] = fVar10 + fVar11;
        A->x[0][2] = 0.0;
        fVar11 = A->x[0][1];
        fVar10 = A->x[1][2];
        A->x[0][1] = fVar11 - (fVar16 * fVar11 + fVar10) * fVar15;
        A->x[1][2] = (fVar11 - fVar16 * fVar10) * fVar15 + fVar10;
        for (lVar2 = 8; lVar2 != 0x2c; lVar2 = lVar2 + 0xc) {
          fVar11 = *(float *)((long)(V->x + -1) + 4 + lVar2);
          fVar10 = *(float *)((long)V->x[0] + lVar2);
          *(float *)((long)(V->x + -1) + 4 + lVar2) = (fVar16 * fVar11 + fVar10) * -fVar15 + fVar11;
          *(float *)((long)V->x[0] + lVar2) = (-fVar16 * fVar10 + fVar11) * fVar15 + fVar10;
        }
        fVar10 = A->x[2][2];
      }
      fVar11 = A->x[1][1];
      fVar12 = A->x[1][2];
      fVar17 = fVar10 - fVar11;
      fVar15 = ABS(fVar12 + fVar12);
      fVar16 = ABS(fVar17) * local_38;
      if (fVar15 <= fVar16) {
        A->x[1][2] = 0.0;
      }
      else {
        fVar17 = fVar17 / (fVar12 + fVar12);
        fVar17 = *(float *)(&DAT_0014a120 + (ulong)(fVar17 < 0.0) * 4) /
                 (SQRT(fVar17 * fVar17 + 1.0) + ABS(fVar17));
        fVar18 = 1.0 / SQRT(fVar17 * fVar17 + 1.0);
        fVar12 = fVar12 * fVar17;
        fVar17 = fVar17 * fVar18;
        fVar18 = fVar17 / (fVar18 + 1.0);
        local_48[1] = fVar9 - fVar12;
        local_48[2] = local_48[2] + fVar12;
        A->x[1][1] = fVar11 - fVar12;
        A->x[2][2] = fVar10 + fVar12;
        A->x[1][2] = 0.0;
        uVar1 = *(undefined8 *)(A->x[0] + 1);
        fVar11 = (float)uVar1;
        fVar10 = (float)((ulong)uVar1 >> 0x20);
        *(ulong *)(A->x[0] + 1) =
             CONCAT44((-fVar18 * fVar10 + fVar11) * fVar17 + fVar10,
                      (fVar18 * fVar11 + fVar10) * -fVar17 + fVar11);
        for (lVar2 = 4; lVar2 != 0x28; lVar2 = lVar2 + 0xc) {
          uVar1 = *(undefined8 *)((long)V->x[0] + lVar2);
          fVar11 = (float)uVar1;
          fVar10 = (float)((ulong)uVar1 >> 0x20);
          *(ulong *)((long)V->x[0] + lVar2) =
               CONCAT44((-fVar18 * fVar10 + fVar11) * fVar17 + fVar10,
                        (fVar18 * fVar11 + fVar10) * -fVar17 + fVar11);
        }
      }
      pfVar3 = (float *)A;
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        fVar11 = local_48[lVar2] + (&S->x)[lVar2];
        (&S->x)[lVar2] = fVar11;
        *pfVar3 = fVar11;
        pfVar3 = pfVar3 + 4;
      }
      if ((fVar14 <= fVar13 && fVar7 <= fVar8) && fVar15 <= fVar16) break;
      BVar6 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix33<float>>(A);
      if (BVar6 <= local_34) {
        return;
      }
      bVar5 = 0x12 < uVar4;
      uVar4 = uVar4 + 1;
      if (bVar5) {
        return;
      }
    }
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix33<T>& A, Vec3<T>& S, Matrix33<T>& V, const T tol)
{
    V.makeIdentity ();
    for (int i = 0; i < 3; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            // Z is for accumulating small changes (h) to diagonal entries
            // of A for one sweep. Adding h's directly to A might cause
            // a cancellation effect when h is relatively very small to
            // the corresponding diagonal entry of A and
            // this will increase numerical errors
            Vec3<T> Z (0, 0, 0);
            ++numIter;
            bool changed = jacobiRotation<0, 1, 2> (A, V, Z, tol);
            changed      = jacobiRotation<0, 2, 1> (A, V, Z, tol) || changed;
            changed      = jacobiRotation<1, 2, 0> (A, V, Z, tol) || changed;
            // One sweep passed. Add accumulated changes (Z) to singular values (S)
            // Update diagonal elements of A for better accuracy as well.
            for (int i = 0; i < 3; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}